

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

int __thiscall zmq::session_base_t::zap_connect(session_base_t *this)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ssize_t sVar5;
  char *__n;
  void *__buf;
  long in_RDI;
  bool bVar6;
  bool ok;
  char *errstr_1;
  msg_t id;
  char *errstr;
  int rc;
  bool conflates [2];
  int hwms [2];
  pipe_t *new_pipes [2];
  object_t *parents [2];
  endpoint_t peer;
  i_pipe_events *in_stack_fffffffffffffa08;
  undefined8 *puVar7;
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  object_t *in_stack_fffffffffffffa18;
  undefined1 local_5a0 [55];
  undefined1 in_stack_fffffffffffffa97;
  undefined8 in_stack_fffffffffffffa98;
  own_t *in_stack_fffffffffffffaa0;
  undefined2 in_stack_fffffffffffffaac;
  undefined2 uVar8;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  EVP_PKEY_CTX *in_stack_fffffffffffffaf0;
  pipe_t **in_stack_fffffffffffffaf8;
  object_t **in_stack_fffffffffffffb00;
  char local_3d4;
  byte local_396;
  int local_4;
  
  if (*(long *)(in_RDI + 0x590) == 0) {
    object_t::find_endpoint
              (in_stack_fffffffffffffa18,
               (char *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
    if (in_stack_fffffffffffffaf0 == (EVP_PKEY_CTX *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0x6f;
      local_4 = -1;
    }
    else {
      bVar6 = true;
      if ((local_3d4 != '\x04') && (bVar6 = true, local_3d4 != '\x06')) {
        bVar6 = local_3d4 == '\f';
      }
      if (!bVar6) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "peer.options.type == ZMQ_REP || peer.options.type == ZMQ_ROUTER || peer.options.type == ZMQ_SERVER"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0x173);
        fflush(_stderr);
        zmq_abort((char *)0x235992);
      }
      uVar8 = 0;
      iVar2 = pipepair(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                       (int *)in_stack_fffffffffffffaf0,
                       (bool *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      if (iVar2 != 0) {
        piVar3 = __errno_location();
        in_stack_fffffffffffffaa0 = (own_t *)strerror(*piVar3);
        fprintf(_stderr,"%s (%s:%d)\n",in_stack_fffffffffffffaa0,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0x17c);
        fflush(_stderr);
        zmq_abort((char *)0x235aa9);
      }
      *(undefined8 *)(in_RDI + 0x590) = 0;
      pipe_t::set_nodelay(*(pipe_t **)(in_RDI + 0x590));
      pipe_t::set_event_sink
                ((pipe_t *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                 in_stack_fffffffffffffa08);
      __n = (char *)0x0;
      object_t::send_bind((object_t *)CONCAT26(uVar8,CONCAT24(in_stack_fffffffffffffaac,iVar2)),
                          in_stack_fffffffffffffaa0,(pipe_t *)in_stack_fffffffffffffa98,
                          (bool)in_stack_fffffffffffffa97);
      if ((local_396 & 1) != 0) {
        iVar2 = msg_t::init((msg_t *)local_5a0,in_stack_fffffffffffffaf0);
        if (iVar2 != 0) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          puVar7 = (undefined8 *)&stderr;
          __n = 
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
          ;
          fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                  ,0x189);
          fflush((FILE *)*puVar7);
          zmq_abort((char *)0x235ba0);
        }
        msg_t::set_flags((msg_t *)local_5a0,'@');
        sVar5 = pipe_t::write(*(pipe_t **)(in_RDI + 0x590),(int)local_5a0,__buf,(size_t)__n);
        bVar1 = (byte)sVar5;
        if (((bVar1 & 1 ^ 0xff) & 1) != 0) {
          puVar7 = (undefined8 *)&stderr;
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ok",
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                  ,0x18c);
          fflush((FILE *)*puVar7);
          zmq_abort((char *)0x235c35);
        }
        pipe_t::flush((pipe_t *)CONCAT17(bVar1,in_stack_fffffffffffffa10));
      }
      local_4 = 0;
    }
    endpoint_t::~endpoint_t((endpoint_t *)0x235c75);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq::session_base_t::zap_connect ()
{
    if (_zap_pipe != NULL)
        return 0;

    endpoint_t peer = find_endpoint ("inproc://zeromq.zap.01");
    if (peer.socket == NULL) {
        errno = ECONNREFUSED;
        return -1;
    }
    zmq_assert (peer.options.type == ZMQ_REP || peer.options.type == ZMQ_ROUTER
                || peer.options.type == ZMQ_SERVER);

    //  Create a bi-directional pipe that will connect
    //  session with zap socket.
    object_t *parents[2] = {this, peer.socket};
    pipe_t *new_pipes[2] = {NULL, NULL};
    int hwms[2] = {0, 0};
    bool conflates[2] = {false, false};
    int rc = pipepair (parents, new_pipes, hwms, conflates);
    errno_assert (rc == 0);

    //  Attach local end of the pipe to this socket object.
    _zap_pipe = new_pipes[0];
    _zap_pipe->set_nodelay ();
    _zap_pipe->set_event_sink (this);

    send_bind (peer.socket, new_pipes[1], false);

    //  Send empty routing id if required by the peer.
    if (peer.options.recv_routing_id) {
        msg_t id;
        rc = id.init ();
        errno_assert (rc == 0);
        id.set_flags (msg_t::routing_id);
        bool ok = _zap_pipe->write (&id);
        zmq_assert (ok);
        _zap_pipe->flush ();
    }

    return 0;
}